

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

long __thiscall
divsufsortxx::core::sort_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
          (core *this,char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long SAsize,
          int alphabetsize)

{
  pos_type pVar1;
  long lVar2;
  iterator last;
  iterator last_00;
  iterator buf;
  bool bVar3;
  long lVar4;
  long lVar5;
  pos_type pVar6;
  ulong uVar7;
  pos_type pVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  BitmapArray<long> *pBVar12;
  long *plVar13;
  long lVar14;
  long lVar15;
  core cVar16;
  long lVar17;
  ulong uVar18;
  pos_type pVar19;
  BitmapArray<long> *pBVar20;
  long lVar21;
  long lVar22;
  long *plVar23;
  long *plVar24;
  iterator first;
  iterator first_00;
  iterator PA;
  iterator PA_00;
  iterator first_01;
  iterator first_02;
  iterator ISA;
  iterator ISA_00;
  iterator last_01;
  iterator last_02;
  ulong local_f8;
  long local_e0;
  value_reference local_80;
  value_reference local_70;
  BitmapArray<long> *local_60;
  pos_type pStack_58;
  BitmapArray<long> *local_50;
  pos_type pStack_48;
  BitmapArray<long> *local_40;
  pos_type pStack_38;
  
  pVar8 = SA.pos_;
  pBVar12 = SA.array_;
  lVar21 = (long)(int)SAsize;
  lVar4 = 0;
  lVar17 = 0;
  if (0 < lVar21) {
    lVar17 = lVar21;
  }
  for (; lVar17 != lVar4; lVar4 = lVar4 + 1) {
    *(undefined8 *)(pVar8 + lVar4 * 8) = 0;
  }
  for (uVar18 = 0; (uint)((int)SAsize * (int)SAsize) != uVar18; uVar18 = uVar18 + 1) {
    bucket_A[uVar18] = 0;
  }
  lVar17 = (long)bucket_B + -1;
  lVar4 = lVar17;
  lVar15 = n;
LAB_00106b3d:
  if (-1 < lVar4) {
    cVar16 = this[lVar4];
    do {
      lVar14 = lVar4;
      plVar13 = (long *)(pVar8 + (long)(char)cVar16 * 8);
      *plVar13 = *plVar13 + 1;
      lVar4 = -1;
      if (lVar14 == 0) goto LAB_00106b3d;
      cVar16 = this[lVar14 + -1];
      lVar4 = lVar14 + -1;
    } while ((char)this[lVar14] <= (char)cVar16);
    bucket_A[(char)cVar16 * (int)SAsize + (int)(char)this[lVar14]] =
         bucket_A[(char)cVar16 * (int)SAsize + (int)(char)this[lVar14]] + 1;
    lVar4 = lVar15 + -1;
    lVar15 = lVar15 + -1;
    (**(code **)(*(long *)T + 0x20))(T,(long)pBVar12 + lVar4,lVar14 + -1);
    for (lVar14 = lVar14 + -2; lVar4 = -1, -1 < lVar14; lVar14 = lVar14 + -1) {
      lVar4 = lVar14;
      if ((char)this[lVar14 + 1] < (char)this[lVar14]) break;
      bucket_A[(char)this[lVar14 + 1] * (int)SAsize + (int)(char)this[lVar14]] =
           bucket_A[(char)this[lVar14 + 1] * (int)SAsize + (int)(char)this[lVar14]] + 1;
    }
    goto LAB_00106b3d;
  }
  uVar18 = 0;
  uVar9 = 0;
  if (0 < (int)SAsize) {
    uVar9 = SAsize & 0xffffffff;
  }
  lVar4 = -1;
  iVar11 = 1;
  lVar14 = 0;
  plVar13 = bucket_A;
  plVar24 = bucket_A;
  for (; uVar18 != uVar9; uVar18 = uVar18 + 1) {
    lVar22 = (long)iVar11;
    plVar23 = (long *)(lVar21 * 8 * lVar22 + (long)plVar13);
    lVar5 = *(long *)(pVar8 + uVar18 * 8);
    *(long *)(pVar8 + uVar18 * 8) = lVar4 + lVar14;
    lVar4 = lVar5 + lVar4 + bucket_A[uVar18 * lVar21 + uVar18];
    for (; lVar22 < lVar21; lVar22 = lVar22 + 1) {
      lVar14 = lVar14 + plVar24[lVar22];
      plVar24[lVar22] = lVar14;
      lVar4 = lVar4 + *plVar23;
      plVar23 = plVar23 + lVar21;
    }
    iVar11 = iVar11 + 1;
    plVar24 = plVar24 + lVar21;
    plVar13 = plVar13 + 1;
  }
  lVar4 = n - lVar15;
  if (lVar4 != 0 && lVar15 <= n) {
    pVar19 = (long)pBVar12 + (n - lVar4);
    lVar14 = (long)pBVar12 + n + -2;
    for (lVar15 = lVar4 + -2; -1 < lVar15; lVar15 = lVar15 + -1) {
      lVar5 = (**(code **)(*(long *)T + 0x28))(T,lVar14);
      lVar22 = (char)this[lVar5] * lVar21 + (long)(char)this[lVar5 + 1];
      lVar5 = bucket_A[lVar22];
      bucket_A[lVar22] = lVar5 + -1;
      (**(code **)(*(long *)T + 0x20))(T,lVar5 + -1 + (long)pBVar12,lVar15);
      lVar14 = lVar14 + -1;
    }
    pVar6 = lVar4 + (long)pBVar12;
    uVar18 = lVar4 - 1;
    lVar15 = (**(code **)(*(long *)T + 0x28))(T,(long)pBVar12 + n + -1);
    lVar14 = (char)this[lVar15] * lVar21 + (long)(char)this[lVar15 + 1];
    lVar15 = bucket_A[lVar14];
    bucket_A[lVar14] = lVar15 + -1;
    (**(code **)(*(long *)T + 0x20))(T,lVar15 + -1 + (long)pBVar12,uVar18);
    lVar14 = n + lVar4 * -2;
    lVar15 = lVar21 * 8 + 8;
    uVar9 = uVar18;
    if (lVar14 < 0x101) {
      plVar13 = (long *)operator_new__(0x800);
      lVar14 = (long)((int)SAsize + -1);
      plVar24 = (long *)(lVar15 * lVar14 + (long)bucket_A);
      lVar15 = lVar4;
      local_e0 = lVar14;
      while (plVar23 = plVar24, lVar5 = lVar14, 0 < lVar15) {
        for (; local_e0 < lVar5; lVar5 = lVar5 + -1) {
          lVar22 = *plVar23;
          if (1 < lVar15 - lVar22) {
            pVar1 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar22;
            pStack_58 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar15;
            local_60 = (BitmapArray<long> *)T;
            uVar7 = (**(code **)(*(long *)T + 0x28))(T,pVar1);
            last_00.pos_ = pStack_58;
            last_00.array_ = local_60;
            PA_00.pos_ = pVar19;
            PA_00.array_ = (BitmapArray<long> *)T;
            first_02.pos_ = pVar1;
            first_02.array_ = (BitmapArray<long> *)T;
            substring::sort<char*,bitmap::BitmapArray<long>::iterator,long*>
                      ((char *)this,PA_00,first_02,last_00,plVar13,0x100,2,(value_type)bucket_B,
                       uVar7 == uVar18,0x400);
          }
          lVar15 = lVar22;
          plVar23 = plVar23 + -1;
        }
        local_e0 = local_e0 + -1;
        plVar24 = plVar24 + -lVar21;
      }
      operator_delete__(plVar13);
    }
    else {
      lVar22 = (long)((int)SAsize + -1);
      plVar13 = (long *)(lVar15 * lVar22 + (long)bucket_A);
      lVar15 = lVar4;
      lVar5 = lVar22;
      while (plVar24 = plVar13, lVar10 = lVar22, 0 < lVar15) {
        for (; lVar5 < lVar10; lVar10 = lVar10 + -1) {
          lVar2 = *plVar24;
          if (1 < lVar15 - lVar2) {
            pVar1 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar2;
            pStack_38 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar15;
            local_50 = (BitmapArray<long> *)T;
            pStack_48 = pVar6;
            local_40 = (BitmapArray<long> *)T;
            uVar7 = (**(code **)(*(long *)T + 0x28))(T,pVar1);
            last.pos_ = pStack_38;
            last.array_ = local_40;
            buf.pos_ = pStack_48;
            buf.array_ = local_50;
            PA.pos_ = pVar19;
            PA.array_ = (BitmapArray<long> *)T;
            first_01.pos_ = pVar1;
            first_01.array_ = (BitmapArray<long> *)T;
            substring::
            sort<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                      ((char *)this,PA,first_01,last,buf,lVar14,2,(value_type)bucket_B,
                       uVar7 == uVar18,0x400);
          }
          lVar15 = lVar2;
          plVar24 = plVar24 + -1;
        }
        lVar5 = lVar5 + -1;
        plVar13 = plVar13 + -lVar21;
      }
    }
    while (-1 < (long)uVar9) {
      lVar15 = (**(code **)(*(long *)T + 0x28))
                         (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + uVar9);
      local_f8 = uVar9;
      uVar7 = uVar9;
      if (-1 < lVar15) {
        do {
          local_f8 = uVar7;
          lVar15 = (**(code **)(*(long *)T + 0x28))
                             (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + local_f8);
          (**(code **)(*(long *)T + 0x20))(T,lVar15 + pVar6,local_f8);
          if ((long)local_f8 < 1) {
            uVar7 = 0;
            local_f8 = 0xffffffffffffffff;
            pBVar20 = pBVar12;
            goto LAB_00107123;
          }
          lVar15 = (**(code **)(*(long *)T + 0x28))(T,(long)pBVar12 + (local_f8 - 1));
          uVar7 = local_f8 - 1;
        } while (-1 < lVar15);
        pBVar20 = (BitmapArray<long> *)((long)&(pBVar12->super_Bitmap)._vptr_Bitmap + local_f8);
        uVar7 = local_f8;
        local_f8 = local_f8 - 1;
LAB_00107123:
        (**(code **)(*(long *)T + 0x20))(T,pBVar20,local_f8 - uVar9);
        if (uVar7 < 2) break;
      }
      uVar9 = local_f8 - 1;
      do {
        uVar7 = uVar9;
        lVar15 = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + uVar7 + 1;
        uVar9 = (**(code **)(*(long *)T + 0x28))(T,lVar15);
        (**(code **)(*(long *)T + 0x20))(T,lVar15,~uVar9);
        lVar15 = (**(code **)(*(long *)T + 0x28))(T,lVar15);
        (**(code **)(*(long *)T + 0x20))(T,lVar15 + pVar6,local_f8);
        lVar15 = (**(code **)(*(long *)T + 0x28))
                           (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + uVar7);
        uVar9 = uVar7 - 1;
      } while (lVar15 < 0);
      lVar15 = (**(code **)(*(long *)T + 0x28))
                         (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + uVar7);
      (**(code **)(*(long *)T + 0x20))(T,lVar15 + pVar6,local_f8);
    }
    first.pos_ = (pos_type)pBVar12;
    first.array_ = (BitmapArray<long> *)T;
    ISA.pos_ = pVar6;
    ISA.array_ = (BitmapArray<long> *)T;
    last_01.pos_ = pVar6;
    last_01.array_ = (BitmapArray<long> *)T;
    bVar3 = tandemrepeat::
            sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                      (ISA,first,last_01);
    if (!bVar3) {
      first_00.pos_ = (pos_type)pBVar12;
      first_00.array_ = (BitmapArray<long> *)T;
      ISA_00.pos_ = pVar6;
      ISA_00.array_ = (BitmapArray<long> *)T;
      last_02.pos_ = pVar6;
      last_02.array_ = (BitmapArray<long> *)T;
      doubling::sort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (ISA_00,first_00,last_02);
    }
    lVar15 = lVar17;
    lVar14 = lVar4;
LAB_00107237:
    if (-1 < lVar15) {
      do {
        lVar5 = lVar15;
        lVar15 = -1;
        if (lVar5 == 0) goto LAB_00107237;
        lVar15 = lVar5 + -1;
      } while ((char)this[lVar5] <= (char)this[lVar5 + -1]);
      lVar15 = lVar14 + pVar6;
      lVar14 = lVar14 + -1;
      lVar15 = (**(code **)(*(long *)T + 0x28))(T,lVar15 + -1);
      (**(code **)(*(long *)T + 0x20))
                (T,(long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar15,lVar5 + -1);
      for (lVar5 = lVar5 + -2;
          (lVar15 = -1, -1 < lVar5 && (lVar15 = lVar5, (char)this[lVar5] <= (char)this[lVar5 + 1]));
          lVar5 = lVar5 + -1) {
      }
      goto LAB_00107237;
    }
    lVar14 = (long)((int)SAsize + -1);
    for (lVar15 = lVar14; -1 < lVar15; lVar15 = lVar15 + -1) {
      lVar22 = lVar15 * lVar21;
      for (lVar5 = lVar14; lVar15 < lVar5; lVar5 = lVar5 + -1) {
        lVar10 = lVar17 - bucket_A[lVar15 + lVar5 * lVar21];
        bucket_A[lVar15 + lVar5 * lVar21] = lVar17 + 1;
        lVar17 = bucket_A[lVar22 + lVar5];
        for (; lVar17 <= (long)uVar18; uVar18 = uVar18 - 1) {
          local_70.pos_ = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + uVar18;
          local_80.pos_ = (long)&(pBVar12->super_Bitmap)._vptr_Bitmap + lVar10;
          local_80.array_ = (BitmapArray<long> *)T;
          local_70.array_ = (BitmapArray<long> *)T;
          bitmap::BitmapArray<long>::value_reference::operator=(&local_80,&local_70);
          lVar10 = lVar10 + -1;
        }
        lVar17 = lVar10;
      }
      lVar5 = bucket_A[lVar22 + lVar15];
      bucket_A[lVar22 + lVar15] = lVar17 + 1;
      if (lVar15 < lVar14) {
        bucket_A[lVar15 + lVar22 + 1] = (lVar17 + 1) - lVar5;
      }
      lVar17 = *(long *)(pVar8 + lVar15 * 8);
    }
  }
  return lVar4;
}

Assistant:

pos_type sort_typeBstar(const StringIterator_type T, SAIterator_type SA,
                        pos_type *bucket_A, pos_type *bucket_B, pos_type n,
                        pos_type SAsize, alphabetsize_type alphabetsize) {
  pos_type i, j, k, t, m, bufsize;
  alphabetsize_type c0, c1;

  /* Initialize bucket arrays. */
  for (i = 0; i < alphabetsize; ++i) {
    bucket_A[i] = 0;
  }
  for (i = 0; i < alphabetsize * alphabetsize; ++i) {
    bucket_B[i] = 0;
  }

  /* Count the number of occurrences of the first one or two characters of each
   type A, B and B* suffix. Moreover, store the beginning position of all
   type B* suffixes into the array SA. */
  for (i = n - 1, m = SAsize; 0 <= i;) {
    /* type A suffix. */
    do {
      ++BUCKET_A(T[i]);
    } while ((0 <= --i) && (T[i] >= T[i + 1]));
    if (0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(T[i], T[i + 1]);
      SA[--m] = i;
      /* type B suffix. */
      for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        ++BUCKET_B(T[i], T[i + 1]);
      }
    }
  }
  m = SAsize - m;

  /* Calculate the index of start/end point of each bucket. */
  for (c0 = 0, i = -1, j = 0; c0 < alphabetsize; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0)= i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for (c1 = c0 + 1; c1 < alphabetsize; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if (0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    SAIterator_type PAb = SA + SAsize - m, ISAb = SA + m;
    for (i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
    bufsize = SAsize - 2 * m;
    if (MERGE_BUFSIZE < bufsize) {
      SAIterator_type buf = SA + m;
      for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
        for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
          i = BUCKET_BSTAR(c0, c1);
          if (1 < (j - i)) {
            substring::sort(T, PAb, SA + i, SA + j, buf, bufsize, 2, n,
                            *(SA + i) == (m - 1));
          }
        }
      }
    } else {
      pos_type *lbuf = NULL;
      int err = 0;
      try {
        lbuf = new pos_type[MERGE_BUFSIZE];
        if (lbuf == NULL) {
          throw;
        }
        for (c0 = alphabetsize - 1, j = m; 0 < j; --c0) {
          for (c1 = alphabetsize - 1; c0 < c1; j = i, --c1) {
            i = BUCKET_BSTAR(c0, c1);
            if (1 < (j - i)) {
              substring::sort(T, PAb, SA + i, SA + j, lbuf, MERGE_BUFSIZE, 2, n,
                              *(SA + i) == (m - 1));
            }
          }
        }
      } catch (...) {
        err = -1;
      }
      delete[] lbuf;
      if (err != 0) {
        throw;
      }
    }

    /* Compute ranks of type B* substrings. */
    for (i = m - 1; 0 <= i; --i) {
      if (0 <= SA[i]) {
        j = i;
        do {
          ISAb[SA[i]] = i;
        } while ((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if (i <= 0) {
          break;
        }
      }
      j = i;
      do {
        ISAb[SA[i] = ~SA[i]] = j;
      } while (SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using tandemrepeat/doubling sorting algorithms. */
    if (tandemrepeat::sort(ISAb, SA, SA + m) == false) {
      doubling::sort(ISAb, SA, SA + m);
    }

    /* Set the sorted order of tyoe B* suffixes. */
    for (i = n - 1, j = m; 0 <= i;) {
      for (--i; (0 <= i) && (T[i] >= T[i + 1]); --i) {
      }
      if (0 <= i) {
        SA[ISAb[--j]] = i;
        for (--i; (0 <= i) && (T[i] <= T[i + 1]); --i) {
        }
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    for (c0 = alphabetsize - 1, i = n - 1, k = m - 1; 0 <= c0; --c0) {
      for (c1 = alphabetsize - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i + 1; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for (i = t, j = BUCKET_BSTAR(c0, c1); j <= k; --i, --k) {
          SA[i] = SA[k];
        }
      }
      t = i - BUCKET_B(c0, c0);
      BUCKET_B(c0, c0) = i + 1; /* end point */
      if (c0 < (alphabetsize - 1)) {
        BUCKET_BSTAR(c0, c0 + 1) = t + 1; /* start point */
      }
      i = BUCKET_A(c0);
    }
  }

  return m;
}